

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t __thiscall
loader::zetDebugInterrupt(loader *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread)

{
  zet_pfnDebugInterrupt_t pfnInterrupt;
  dditable_t *dditable;
  ze_result_t result;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  if (*(code **)(*(long *)(this + 8) + 0x840) == (code *)0x0) {
    thread_local.eu = 0x78000001;
  }
  else {
    thread_local.eu =
         (**(code **)(*(long *)(this + 8) + 0x840))(*(undefined8 *)this,hDebug,thread._0_8_);
  }
  return thread_local.eu;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugInterrupt(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread                       ///< [in] the thread to interrupt
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->dditable;
        auto pfnInterrupt = dditable->zet.Debug.pfnInterrupt;
        if( nullptr == pfnInterrupt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDebug = reinterpret_cast<zet_debug_session_object_t*>( hDebug )->handle;

        // forward to device-driver
        result = pfnInterrupt( hDebug, thread );

        return result;
    }